

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::anon_unknown_0::DiskSourceTreeTest::AddFile
          (DiskSourceTreeTest *this,string *filename,char *contents)

{
  char *pcVar1;
  Nonnull<const_char_*> failure_msg;
  string_view contents_00;
  StatusRep *local_28 [2];
  
  pcVar1 = (char *)strlen((char *)filename);
  contents_00._M_str = pcVar1;
  contents_00._M_len = (size_t)local_28;
  File::WriteStringToFile(contents_00,filename);
  if (local_28[0] == (StatusRep *)0x1) {
    return;
  }
  failure_msg = absl::lts_20250127::status_internal::MakeCheckFailString
                          ((Nonnull<const_absl::Status_*>)local_28,
                           "File::SetContents(filename, contents, true) is OK");
  if (((ulong)local_28[0] & 1) == 0) {
    absl::lts_20250127::status_internal::StatusRep::Unref(local_28[0]);
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_28,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/importer_unittest.cc"
             ,0x106,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_28);
}

Assistant:

void AddFile(const std::string& filename, const char* contents) {
    ABSL_CHECK_OK(File::SetContents(filename, contents, true));
  }